

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

bool QFileSystemEngine::setFileTime(int fd,QDateTime *newDate,FileTime time,QSystemError *error)

{
  bool bVar1;
  QSystemError QVar2;
  
  bVar1 = QDateTime::isValid(newDate);
  QVar2.errorCode = 0x26;
  QVar2.errorScope = StandardLibraryError;
  if (!bVar1) {
    QVar2.errorCode = 0x16;
    QVar2.errorScope = StandardLibraryError;
  }
  if (0xfffffffd < time - FileModificationTime) {
    QVar2.errorCode = 0x16;
    QVar2.errorScope = StandardLibraryError;
  }
  *error = QVar2;
  return false;
}

Assistant:

bool QFileSystemEngine::setFileTime(int fd, const QDateTime &newDate, QFile::FileTime time, QSystemError &error)
{
    if (!newDate.isValid()
        || time == QFile::FileBirthTime || time == QFile::FileMetadataChangeTime) {
        error = QSystemError(EINVAL, QSystemError::StandardLibraryError);
        return false;
    }

#if QT_CONFIG(futimens)
    // UTIME_OMIT: leave file timestamp unchanged
    struct timespec ts[2] = {{0, UTIME_OMIT}, {0, UTIME_OMIT}};

    if (time == QFile::FileAccessTime || time == QFile::FileModificationTime) {
        const int idx = time == QFile::FileAccessTime ? 0 : 1;
        const std::chrono::milliseconds msecs{newDate.toMSecsSinceEpoch()};
        ts[idx] = durationToTimespec(msecs);
    }

    if (futimens(fd, ts) == -1) {
        error = QSystemError(errno, QSystemError::StandardLibraryError);
        return false;
    }

    return true;
#else
    Q_UNUSED(fd);
    error = QSystemError(ENOSYS, QSystemError::StandardLibraryError);
    return false;
#endif
}